

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

bool CoreML::hasSufficientBytesInQuantizedWeightParam(WeightParams *weight,uint64_t units)

{
  QuantizationParams *pQVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  undefined1 *puVar7;
  uint uVar8;
  undefined1 uVar9;
  
  pQVar1 = weight->quantization_;
  puVar7 = (undefined1 *)pQVar1;
  if (pQVar1 == (QuantizationParams *)0x0) {
    puVar7 = Specification::_QuantizationParams_default_instance_;
  }
  iVar6 = (weight->floatvalue_).current_size_;
  lVar2 = *(long *)(((ulong)(weight->float16value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar8 = (0 < iVar6) + 1;
  if (lVar2 == 0) {
    uVar8 = (uint)(0 < iVar6);
  }
  lVar3 = *(long *)(((ulong)(weight->rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  lVar4 = *(long *)(((ulong)(weight->int8rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar5 = (uint)(lVar4 == 0);
  uVar8 = (uVar8 - (lVar3 == 0)) + 2;
  uVar9 = 4;
  if (uVar8 - uVar5 < 2) {
    uVar9 = 5;
    if (uVar8 != uVar5) {
      uVar9 = iVar6 < 1;
    }
    if ((((lVar2 == 0) && (uVar8 != uVar5)) && (iVar6 < 1)) &&
       (((lVar3 == 0 ||
         (uVar9 = 2,
         weight == (WeightParams *)Specification::_WeightParams_default_instance_ ||
         pQVar1 == (QuantizationParams *)0x0)) &&
        ((lVar4 == 0 ||
         (uVar9 = 3,
         weight == (WeightParams *)Specification::_WeightParams_default_instance_ ||
         pQVar1 == (QuantizationParams *)0x0)))))) {
      uVar9 = 5;
    }
  }
  switch(uVar9) {
  case 0:
    iVar6 = iVar6 << 2;
    break;
  case 1:
    iVar6 = (int)lVar2;
    break;
  case 2:
    iVar6 = (int)lVar3;
    break;
  case 3:
    iVar6 = (int)lVar4;
    break;
  default:
    iVar6 = 0;
  }
  return ((QuantizationParams *)puVar7)->numberofbits_ * units + 7 >> 3 <= (ulong)(long)iVar6;
}

Assistant:

inline const ::CoreML::Specification::QuantizationParams& WeightParams::_internal_quantization() const {
  const ::CoreML::Specification::QuantizationParams* p = quantization_;
  return p != nullptr ? *p : reinterpret_cast<const ::CoreML::Specification::QuantizationParams&>(
      ::CoreML::Specification::_QuantizationParams_default_instance_);
}